

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testpixmap.cpp
# Opt level: O1

void print_RGB_image(uchar *storage,char *name,int width,int height,bool top_first)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  undefined3 in_register_00000081;
  int iVar7;
  int iVar8;
  int iVar9;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RGB for ",8);
  if (CONCAT31(in_register_00000081,top_first) == 0) {
    if (name == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x108140);
    }
    else {
      sVar2 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," last row first",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    if (0 < height) {
      iVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Row ",4);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,height + -1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        if (0 < width) {
          pbVar4 = storage + (long)iVar5 + 2;
          iVar5 = iVar5 + width * 3;
          iVar9 = 0;
          uVar6 = 0;
          iVar7 = width;
          do {
            if ((uVar6 / 5) * 5 + iVar9 == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
              std::ostream::put('@');
              std::ostream::flush();
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)pbVar4[-2]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)pbVar4[-1]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)*pbVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
            uVar6 = uVar6 + 1;
            pbVar4 = pbVar4 + 3;
            iVar9 = iVar9 + -1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
        std::ostream::put('@');
        std::ostream::flush();
        bVar1 = 1 < height;
        height = height + -1;
      } while (bVar1);
    }
  }
  else {
    if (name == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x108140);
    }
    else {
      sVar2 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," first row first",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    if (0 < height) {
      iVar7 = 0;
      iVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Row ",4);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        if (0 < width) {
          pbVar4 = storage + (long)iVar7 + 2;
          iVar7 = iVar7 + width * 3;
          iVar8 = 0;
          uVar6 = 0;
          iVar9 = width;
          do {
            if ((uVar6 / 5) * 5 + iVar8 == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
              std::ostream::put('@');
              std::ostream::flush();
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)pbVar4[-2]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)pbVar4[-1]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)*pbVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
            uVar6 = uVar6 + 1;
            pbVar4 = pbVar4 + 3;
            iVar8 = iVar8 + -1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
        std::ostream::put('@');
        std::ostream::flush();
        iVar5 = iVar5 + 1;
      } while (iVar5 != height);
    }
  }
  return;
}

Assistant:

void
print_RGB_image(unsigned const char *storage, const char *name, int width,
                int height, bool top_first)
{
  int row, col, index = 0;
  if (top_first) {
    cout << "RGB for " << name << " first row first" << endl;
    for (row = 0; row < height; row++) {
      cout << "Row " << row << ":";
      for (col = 0; col < width; col++) {
        if ((col / 5) * 5 == col)
          cout << endl;
        cout << " (" << (int)storage[index] << "," << (int)storage[index + 1]
             << "," << (int)storage[index + 2] << ")";
        index += 3;
      }
      cout << endl;
    }
  } else {
    cout << "RGB for " << name << " last row first" << endl;
    for (row = height - 1; row >= 0; row--) {
      cout << "Row " << row << ":";
      for (col = 0; col < width; col++) {
        if ((col / 5) * 5 == col)
          cout << endl;
        cout << " (" << (int)storage[index] << "," << (int)storage[index + 1]
             << "," << (int)storage[index + 2] << ")";
        index += 3;
      }
      cout << endl;
    }
  }
}